

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peeker.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::xpression_peeker<char>::
accept<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>>
          (xpression_peeker<char> *this,
          string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>_>
          *xpr)

{
  pointer pcVar1;
  
  hash_peek_bitset<char>::
  set_char<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (this->bset_,*(xpr->str_)._M_dataplus._M_p,true,
             (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)this->traits_);
  pcVar1 = (xpr->str_)._M_dataplus._M_p;
  (this->str_).begin_ = pcVar1;
  (this->str_).end_ = pcVar1 + (xpr->str_)._M_string_length;
  (this->str_).icase_ = true;
  return;
}

Assistant:

mpl::false_ accept(string_matcher<Traits, ICase> const &xpr)
    {
        this->bset_.set_char(xpr.str_[0], ICase(), this->get_traits_<Traits>());
        this->str_.begin_ = detail::data_begin(xpr.str_);
        this->str_.end_ = detail::data_end(xpr.str_);
        this->str_.icase_ = ICase::value;
        return mpl::false_();
    }